

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O0

error<idx2::mmap_err_code> idx2::UnmapFile(mmap_file *MMap)

{
  int iVar1;
  error<idx2::mmap_err_code> eVar2;
  mmap_file *local_50;
  mmap_err_code local_48;
  undefined2 uStack_44;
  anon_class_1_0_00000001 local_39;
  mmap_file *local_38;
  mmap_err_code local_30;
  undefined2 uStack_2c;
  anon_class_1_0_00000001 local_21;
  mmap_file *local_20;
  mmap_file *MMap_local;
  mmap_err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  local_20 = MMap;
  iVar1 = munmap((MMap->Buf).Data,(MMap->Buf).Bytes);
  if (iVar1 == -1) {
    eVar2 = UnmapFile::anon_class_1_0_00000001::operator()(&local_21);
    local_38 = (mmap_file *)eVar2.Msg;
    MMap_local = local_38;
    local_30 = eVar2.Code;
    local_10 = local_30;
    uStack_2c = eVar2._12_2_;
    uStack_c = uStack_2c;
  }
  else {
    (local_20->Buf).Data = (byte *)0x0;
    (local_20->Buf).Bytes = 0;
    eVar2 = UnmapFile::anon_class_1_0_00000001::operator()(&local_39);
    local_50 = (mmap_file *)eVar2.Msg;
    MMap_local = local_50;
    local_48 = eVar2.Code;
    local_10 = local_48;
    uStack_44 = eVar2._12_2_;
    uStack_c = uStack_44;
  }
  eVar2.Code = local_10;
  eVar2.Msg = (cstr)MMap_local;
  eVar2.StackIdx = (undefined1)uStack_c;
  eVar2.StrGened = (bool)uStack_c._1_1_;
  eVar2._14_2_ = uStack_a;
  return eVar2;
}

Assistant:

error<mmap_err_code>
UnmapFile(mmap_file* MMap)
{
#if defined(_WIN32)
  if (!UnmapViewOfFile(MMap->Buf.Data))
  {
    CloseHandle(MMap->FileMapping);
    return idx2_Error(mmap_err_code::UnmapFailed);
  }
  if (!CloseHandle(MMap->FileMapping))
    return idx2_Error(mmap_err_code::UnmapFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  if (munmap(MMap->Buf.Data, MMap->Buf.Bytes) == -1)
    return idx2_Error(mmap_err_code::UnmapFailed);
#endif
  MMap->Buf.Data = nullptr;
  MMap->Buf.Bytes = 0;
  return idx2_Error(mmap_err_code::NoError);
}